

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::getAttributeEncodedValue(CFIReaderImpl *this,int idx)

{
  size_type sVar1;
  const_reference pvVar2;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_register_00000034;
  shared_ptr<const_Assimp::FIValue> sVar4;
  int idx_local;
  CFIReaderImpl *this_local;
  
  if (-1 < in_EDX) {
    sVar1 = std::
            vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
            ::size((vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                    *)(CONCAT44(in_register_00000034,idx) + 0x148));
    if (in_EDX < (int)sVar1) {
      pvVar2 = std::
               vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
               ::operator[]((vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                             *)(CONCAT44(in_register_00000034,idx) + 0x148),(long)in_EDX);
      std::shared_ptr<const_Assimp::FIValue>::shared_ptr
                ((shared_ptr<const_Assimp::FIValue> *)this,&pvVar2->value);
      _Var3._M_pi = extraout_RDX_00;
      goto LAB_00a9e722;
    }
  }
  std::shared_ptr<const_Assimp::FIValue>::shared_ptr
            ((shared_ptr<const_Assimp::FIValue> *)this,(nullptr_t)0x0);
  _Var3._M_pi = extraout_RDX;
LAB_00a9e722:
  sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> getAttributeEncodedValue(int idx) const /*override*/ {
        if (idx < 0 || idx >= (int)attributes.size()) {
            return nullptr;
        }
        return attributes[idx].value;
    }